

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# private_to_local_pass.cpp
# Opt level: O3

Function * __thiscall
spvtools::opt::PrivateToLocalPass::FindLocalFunction(PrivateToLocalPass *this,Instruction *inst)

{
  IRContext *this_00;
  DefUseManager *this_01;
  uint32_t id;
  bool found_first_use;
  Function *target_function;
  undefined1 local_49;
  Function *local_48;
  _Any_data local_40;
  code *local_30;
  code *local_28;
  
  local_49 = 0;
  local_48 = (Function *)0x0;
  this_00 = (this->super_Pass).context_;
  if ((this_00->valid_analyses_ & kAnalysisBegin) == kAnalysisNone) {
    IRContext::BuildDefUseManager(this_00);
  }
  this_01 = (this_00->def_use_mgr_)._M_t.
            super___uniq_ptr_impl<spvtools::opt::analysis::DefUseManager,_std::default_delete<spvtools::opt::analysis::DefUseManager>_>
            ._M_t.
            super__Tuple_impl<0UL,_spvtools::opt::analysis::DefUseManager_*,_std::default_delete<spvtools::opt::analysis::DefUseManager>_>
            .super__Head_base<0UL,_spvtools::opt::analysis::DefUseManager_*,_false>._M_head_impl;
  id = 0;
  if (inst->has_result_id_ == true) {
    id = Instruction::GetSingleWordOperand(inst,(uint)inst->has_type_id_);
  }
  local_40._8_8_ = 0;
  local_40._M_unused._M_object = operator_new(0x18);
  *(Function ***)local_40._M_unused._0_8_ = &local_48;
  *(undefined1 **)((long)local_40._M_unused._0_8_ + 8) = &local_49;
  *(PrivateToLocalPass **)((long)local_40._M_unused._0_8_ + 0x10) = this;
  local_28 = std::
             _Function_handler<void_(spvtools::opt::Instruction_*),_(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/ValveSoftware[P]Fossilize/cli/SPIRV-Tools/source/opt/private_to_local_pass.cpp:93:7)>
             ::_M_invoke;
  local_30 = std::
             _Function_handler<void_(spvtools::opt::Instruction_*),_(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/ValveSoftware[P]Fossilize/cli/SPIRV-Tools/source/opt/private_to_local_pass.cpp:93:7)>
             ::_M_manager;
  analysis::DefUseManager::ForEachUser
            (this_01,id,(function<void_(spvtools::opt::Instruction_*)> *)&local_40);
  if (local_30 != (code *)0x0) {
    (*local_30)(&local_40,&local_40,__destroy_functor);
  }
  return local_48;
}

Assistant:

Function* PrivateToLocalPass::FindLocalFunction(const Instruction& inst) const {
  bool found_first_use = false;
  Function* target_function = nullptr;
  context()->get_def_use_mgr()->ForEachUser(
      inst.result_id(),
      [&target_function, &found_first_use, this](Instruction* use) {
        BasicBlock* current_block = context()->get_instr_block(use);
        if (current_block == nullptr) {
          return;
        }

        if (!IsValidUse(use)) {
          found_first_use = true;
          target_function = nullptr;
          return;
        }
        Function* current_function = current_block->GetParent();
        if (!found_first_use) {
          found_first_use = true;
          target_function = current_function;
        } else if (target_function != current_function) {
          target_function = nullptr;
        }
      });
  return target_function;
}